

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_LABEL(Context *ctx)

{
  RegisterList *item;
  RegisterList *pRVar1;
  Buffer *pBVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  size_t in_R8;
  RegisterList *pRVar6;
  char src0 [64];
  char acStack_58 [72];
  
  make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,acStack_58,in_R8);
  pRVar1 = (ctx->used_registers).next;
  pRVar6 = (RegisterList *)0x0;
  if (pRVar1 != (RegisterList *)0x0) {
    uVar3 = ctx->source_args[0].regnum | 0x120000;
    do {
      uVar5 = pRVar1->regtype << 0x10 | pRVar1->regnum;
      pRVar6 = pRVar1;
      if ((uVar3 == uVar5) || (pRVar6 = (RegisterList *)0x0, uVar3 < uVar5)) break;
      pRVar1 = pRVar1->next;
    } while (pRVar1 != (RegisterList *)0x0);
  }
  if (ctx->output != ctx->subroutines) {
    __assert_fail("ctx->output == ctx->subroutines",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1567,"void emit_METAL_LABEL(Context *)");
  }
  if (ctx->indent != 0) {
    __assert_fail("ctx->indent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1568,"void emit_METAL_LABEL(Context *)");
  }
  if (pRVar6 != (RegisterList *)0x0) {
    pcVar4 = "";
    if (pRVar6->misc == 1) {
      pcVar4 = "int aL";
    }
    goto LAB_00112de9;
  }
  pBVar2 = ctx->ignore;
  if (pBVar2 == (Buffer *)0x0) {
    pBVar2 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->ignore = pBVar2;
    if (pBVar2 != (Buffer *)0x0) goto LAB_00112dde;
  }
  else {
LAB_00112dde:
    ctx->output = pBVar2;
  }
  pcVar4 = "";
LAB_00112de9:
  output_line(ctx,"static void %s(%s)",acStack_58,pcVar4);
  output_line(ctx,"{");
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_LABEL(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    const int label = ctx->source_args[0].regnum;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, label);
    assert(ctx->output == ctx->subroutines);  // not mainline, etc.
    assert(ctx->indent == 0);  // we shouldn't be in the middle of a function.

    // MSDN specs say CALL* has to come before the LABEL, so we know if we
    //  can ditch the entire function here as unused.
    if (reg == NULL)
        set_output(ctx, &ctx->ignore);  // Func not used. Parse, but don't output.

    // !!! FIXME: it would be nice if we could determine if a function is
    // !!! FIXME:  only called once and, if so, forcibly inline it.

    // !!! FIXME: this worked in GLSL because all our state is global to the shader,
    // !!! FIXME:  but in metal we kept it local to the shader mainline.
    // !!! FIXME:  Can we do C++11 lambdas in Metal to have nested functions?  :)

    const char *uses_loopreg = ((reg) && (reg->misc == 1)) ? "int aL" : "";
    output_line(ctx, "static void %s(%s)", src0, uses_loopreg);
    output_line(ctx, "{");
    ctx->indent++;
}